

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

SourceLibrary * __thiscall slang::ast::Symbol::getSourceLibrary(Symbol *this)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  DefinitionSymbol *pDVar3;
  
  do {
    SVar1 = (((InstanceSymbol *)this)->super_InstanceSymbolBase).super_Symbol.kind;
    if ((int)SVar1 < 0x2f) {
      if (SVar1 == Definition) {
        return (SourceLibrary *)((InstanceSymbol *)((long)this + 0x280))->body;
      }
      if (SVar1 == CompilationUnit) {
        return *(SourceLibrary **)
                &(((InstanceSymbol *)((long)this + 0x80))->super_InstanceSymbolBase).super_Symbol;
      }
    }
    else {
      if (SVar1 == Instance) {
        pDVar3 = InstanceSymbol::getDefinition((InstanceSymbol *)this);
LAB_0024c9ed:
        return pDVar3->sourceLibrary;
      }
      if (SVar1 == InstanceBody) {
        pDVar3 = (DefinitionSymbol *)
                 (((InstanceSymbol *)((long)this + 0x80))->super_InstanceSymbolBase).super_Symbol.
                 name._M_str;
        goto LAB_0024c9ed;
      }
    }
    pSVar2 = (((InstanceSymbol *)this)->super_InstanceSymbolBase).super_Symbol.parentScope;
    if (pSVar2 == (Scope *)0x0) {
      return (SourceLibrary *)0x0;
    }
    this = pSVar2->thisSym;
  } while( true );
}

Assistant:

const SourceLibrary* Symbol::getSourceLibrary() const {
    auto curr = this;
    while (true) {
        switch (curr->kind) {
            case SymbolKind::Definition:
                return &curr->as<DefinitionSymbol>().sourceLibrary;
            case SymbolKind::CompilationUnit:
                return &curr->as<CompilationUnitSymbol>().sourceLibrary;
            case SymbolKind::InstanceBody:
                return &curr->as<InstanceBodySymbol>().getDefinition().sourceLibrary;
            case SymbolKind::Instance:
                return &curr->as<InstanceSymbol>().getDefinition().sourceLibrary;
            default:
                auto scope = curr->getParentScope();
                if (!scope)
                    return nullptr;

                curr = &scope->asSymbol();
                break;
        }
    }
}